

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O3

vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
* __thiscall
polyscope::render::backend_openGL_mock::GLTextureBuffer::getDataVector3
          (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           *__return_storage_ptr__,GLTextureBuffer *this)

{
  runtime_error *this_00;
  int iVar1;
  
  iVar1 = dimension(&(this->super_TextureBuffer).format);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  if (iVar1 == 3) {
    std::runtime_error::runtime_error(this_00,"not implemented");
  }
  else {
    std::runtime_error::runtime_error
              (this_00,"called getDataVector3 on texture which does not have a 3 dimensional format"
              );
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<glm::vec3> GLTextureBuffer::getDataVector3() {
  if (dimension(format) != 3)
    throw std::runtime_error("called getDataVector3 on texture which does not have a 3 dimensional format");
  throw std::runtime_error("not implemented");

  std::vector<glm::vec3> outData;
  outData.resize(getSizeX() * getSizeY());

  return outData;
}